

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O1

bool __thiscall Clasp::ClaspFacade::SolveStrategy::Async::doWait(Async *this,double t)

{
  SafeIntType *pSVar1;
  __int_type _Var2;
  __int_type _Var3;
  long lVar4;
  bool bVar5;
  unique_lock<std::mutex> lock;
  double local_50;
  unique_lock<std::mutex> local_48;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  
  local_48._M_device = &this->mqMutex_;
  local_48._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_48);
  local_48._M_owns = true;
  local_50 = t;
  do {
    while (((this->super_SolveStrategy).signal_.super___atomic_base<unsigned_int>._M_i != 0 &&
           (((this->super_SolveStrategy).state_.super___atomic_base<unsigned_int>._M_i & 3) != 0)))
    {
      std::condition_variable::notify_all();
LAB_0011ced7:
      std::condition_variable::wait((unique_lock *)&this->mqCond_);
    }
    _Var2 = (this->super_SolveStrategy).state_.super___atomic_base<unsigned_int>._M_i;
    if (_Var2 != 1) {
      std::unique_lock<std::mutex>::~unique_lock(&local_48);
      pSVar1 = &(this->super_SolveStrategy).state_;
      LOCK();
      _Var3 = (pSVar1->super___atomic_base<unsigned_int>)._M_i;
      if (_Var3 == 10) {
        (pSVar1->super___atomic_base<unsigned_int>)._M_i = 2;
        _Var3 = 10;
      }
      UNLOCK();
      if (_Var3 == 4) {
        pSVar1 = &(this->super_SolveStrategy).state_;
        LOCK();
        bVar5 = (pSVar1->super___atomic_base<unsigned_int>)._M_i == 4;
        if (bVar5) {
          (pSVar1->super___atomic_base<unsigned_int>)._M_i = 0xc;
        }
        UNLOCK();
        if (bVar5) {
          std::thread::join();
        }
      }
      goto LAB_0011cf6f;
    }
    if (local_50 < 0.0) goto LAB_0011ced7;
    if (local_50 <= 0.0) {
      std::unique_lock<std::mutex>::~unique_lock(&local_48);
LAB_0011cf6f:
      return _Var2 != 1;
    }
    lVar4 = std::chrono::_V2::steady_clock::now();
    local_38.__d.__r = (duration)((long)(local_50 * 1000.0) * 1000000 + lVar4);
    std::condition_variable::
    __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              (&(this->mqCond_).super_condition_variable,&local_48,&local_38);
    local_50 = 0.0;
  } while( true );
}

Assistant:

virtual bool doWait(double t) {
		for (mt::unique_lock<Clasp::mt::mutex> lock(mqMutex_);;) {
			if (signal() && running()) { // propagate signal to async thread and force wait
				mqCond_.notify_all();
				mqCond_.wait(lock);
			}
			else if (ready()) { break; }
			else if (t < 0.0) { mqCond_.wait(lock); }
			else if (t > 0.0) { mqCond_.wait_for(lock, t); t = 0.0; }
			else              { return false; }
		}
		assert(ready());
		// acknowledge current model or join if first to see done
		if (compare_and_swap(state_, uint32(state_next), uint32(state_model)) == state_done
			&& compare_and_swap(state_, uint32(state_done), uint32(state_join)) == state_done) {
			task_.join();
		}
		return true;
	}